

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O0

char * cmTargetPropertyComputer::GetProperty<cmTarget>
                 (cmTarget *tgt,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  char *loc;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  string *prop_local;
  cmTarget *tgt_local;
  
  tgt_local = (cmTarget *)GetLocation<cmTarget>(tgt,prop,messenger,context);
  if (tgt_local == (cmTarget *)0x0) {
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      tgt_local = (cmTarget *)0x0;
    }
    else {
      bVar1 = std::operator==(prop,"SOURCES");
      if (bVar1) {
        tgt_local = (cmTarget *)GetSources<cmTarget>(tgt,messenger,context);
      }
      else {
        tgt_local = (cmTarget *)0x0;
      }
    }
  }
  return &tgt_local->IsGeneratorProvided;
}

Assistant:

static const char* GetProperty(Target const* tgt, const std::string& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)
  {
    if (const char* loc = GetLocation(tgt, prop, messenger, context)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccured()) {
      return nullptr;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, messenger, context);
    }
    return nullptr;
  }